

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O1

size_t __thiscall ExportDirWrapper::mapNames(ExportDirWrapper *this)

{
  uint uVar1;
  Executable *pEVar2;
  int iVar3;
  offset_t oVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type_conflict *pmVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar5;
  
  oVar4 = DataDirEntryWrapper::getDirEntryAddress(&this->super_DataDirEntryWrapper);
  pEVar2 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
           super_ExeElementWrapper.m_Exe;
  sVar7 = 0;
  iVar3 = (*(pEVar2->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])(pEVar2,oVar4,2,0x28,0)
  ;
  lVar5 = CONCAT44(extraout_var,iVar3);
  if (lVar5 != 0) {
    uVar1 = *(uint *)(lVar5 + 0x18);
    if ((ulong)uVar1 == 0) {
      sVar7 = 0;
    }
    else {
      uVar8 = (ulong)*(uint *)(lVar5 + 0x24);
      sVar7 = 0;
      do {
        pEVar2 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                 super_ExeElementWrapper.m_Exe;
        iVar3 = (*(pEVar2->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                          (pEVar2,uVar8,2,2,0);
        if ((key_type_conflict1 *)CONCAT44(extraout_var_00,iVar3) == (key_type_conflict1 *)0x0) {
          return sVar7;
        }
        pmVar6 = std::
                 map<unsigned_short,_unsigned_int,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_int>_>_>
                 ::operator[](&this->ordToNameId,
                              (key_type_conflict1 *)CONCAT44(extraout_var_00,iVar3));
        *pmVar6 = (mapped_type_conflict)sVar7;
        uVar8 = uVar8 + 2;
        sVar7 = sVar7 + 1;
      } while (uVar1 != sVar7);
    }
  }
  return sVar7;
}

Assistant:

size_t ExportDirWrapper::mapNames()
{
    IMAGE_EXPORT_DIRECTORY* exp = exportDir();
    if (exp == NULL) return 0;

    size_t maxNames = exp->NumberOfNames;

    offset_t nameOrdRVA = exp->AddressOfNameOrdinals;
    //uint64_t nameRVA = exp->AddressOfNames;
    size_t i = 0;
    for (i = 0; i < maxNames; i++) {

        WORD* nameOrd = (WORD*) this->m_Exe->getContentAt(nameOrdRVA, Executable::RVA, sizeof(WORD));
        //DWORD* name = (DWORD*) this->m_Exe->getContentAt(nameRVA, Executable::RVA, sizeof(DWORD));
        if (nameOrd == NULL) break;

        this->ordToNameId[*nameOrd] = i;//*name;

        nameOrdRVA += sizeof(WORD);
        //nameRVA += sizeof(DWORD);
    }
    return i;
}